

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::Decode(GridAxisIrregular *this,KDataStream *stream)

{
  pointer puVar1;
  iterator iVar2;
  vector<unsigned_short,std::allocator<unsigned_short>> *this_00;
  KUINT16 KVar3;
  KException *this_01;
  ushort uVar4;
  ushort uVar5;
  KUINT16 ui16TmpVal;
  KString local_58;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar3) {
    puVar1 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    puVar1 = (this->m_vui16Padding).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    GridAxisRegular::Decode(&this->super_GridAxisRegular,stream);
    KDataStream::Read<double>(stream,(double *)&this->m_f64CoordScaleXi);
    KDataStream::Read<double>(stream,(double *)&this->m_f64CoordOffsetXi);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffff0000;
    if ((this->super_GridAxisRegular).m_ui16NumPoints != 0) {
      local_38 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Padding;
      uVar5 = 0;
      do {
        KDataStream::Read<unsigned_short>(stream,(unsigned_short *)&local_58);
        iVar2._M_current =
             (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vXiValues,
                     iVar2,(unsigned_short *)&local_58);
        }
        else {
          *iVar2._M_current = (unsigned_short)local_58._M_dataplus._M_p;
          (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        this_00 = local_38;
        uVar5 = uVar5 + 1;
        uVar4 = (this->super_GridAxisRegular).m_ui16NumPoints;
      } while (uVar5 < uVar4);
      for (uVar4 = uVar4 & 3; uVar4 != 0; uVar4 = uVar4 - 1) {
        KDataStream::Read<unsigned_short>(stream,(unsigned_short *)&local_58);
        iVar2._M_current =
             (this->m_vui16Padding).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vui16Padding).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>(this_00,iVar2,(unsigned_short *)&local_58);
        }
        else {
          *iVar2._M_current = (unsigned_short)local_58._M_dataplus._M_p;
          (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
  KException::KException(this_01,&local_58,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridAxisIrregular::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_AXIS_IRREGULAR )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vXiValues.clear();
    m_vui16Padding.clear();

    GridAxisRegular::Decode( stream );

    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}